

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icuinfo.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__s;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int local_1c;
  
  iVar1 = u_parseArgs(argc,argv,8,options);
  if (iVar1 < 0) {
    fprintf(_stderr,"error in command line argument \"%s\"\n",argv[(uint)-iVar1]);
  }
  if (options[1].doesOccur == '\0' && options[0].doesOccur == '\0') {
    if (options[2].doesOccur != '\0') {
      u_setDataDirectory_63(options[2].value);
    }
    bVar2 = options[5].doesOccur != '\0';
    if (bVar2) {
      uprv_getUTCtime_63();
      printf("Milliseconds since Epoch: %.0f\n");
    }
    bVar3 = options[4].doesOccur != '\0';
    bVar4 = options[3].doesOccur != '\0';
    if (bVar4) {
      main_cold_1();
    }
    bVar4 = bVar4 || (bVar3 || bVar2);
    if (options[7].doesOccur != '\0') {
      __s = fopen(options[7].value,"w");
      bVar2 = __s == (FILE *)0x0;
      if (bVar2) {
        main_cold_2();
      }
      else {
        fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n",0x28,1,__s);
        udbg_writeIcuInfo((FILE *)__s);
        fclose(__s);
      }
      bVar4 = !bVar2 || bVar4;
      if (__s == (FILE *)0x0) {
        return (uint)bVar2;
      }
    }
    if (options[6].doesOccur != '\0') {
      u_cleanup_63();
      fwrite("ICU u_cleanup() called.\n",0x18,1,_stdout);
      bVar4 = true;
    }
    local_1c = 0;
    if (!bVar4) {
      main_cold_3();
    }
  }
  else {
    main_cold_4();
  }
  return local_1c;
}

Assistant:

extern int
main(int argc, char* argv[]) {
    UErrorCode errorCode = U_ZERO_ERROR;
    UBool didSomething = FALSE;
    
    /* preset then read command line options */
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);

    /* error handling, printing usage message */
    if(argc<0) {
        fprintf(stderr,
            "error in command line argument \"%s\"\n",
            argv[-argc]);
    }
    if( options[0].doesOccur || options[1].doesOccur) {
      fprintf(stderr, "%s: Output information about the current ICU\n", argv[0]);
      fprintf(stderr, "Options:\n"
              " -h     or  --help                 - Print this help message.\n"
              " -m     or  --millisecond-time     - Print the current UTC time in milliseconds.\n"
              " -d <dir>   or  --icudatadir <dir> - Set the ICU Data Directory\n"
              " -v                                - Print version and configuration information about ICU\n"
#if UCONFIG_ENABLE_PLUGINS
              " -L         or  --list-plugins     - List and diagnose issues with ICU Plugins\n"
#endif
              " -K         or  --cleanup          - Call u_cleanup() before exitting (will attempt to unload plugins)\n"
              "\n"
              "If no arguments are given, the tool will print ICU version and configuration information.\n"
              );
      fprintf(stderr, "International Components for Unicode %s\n%s\n", U_ICU_VERSION, U_COPYRIGHT_STRING );
      return argc<0 ? U_ILLEGAL_ARGUMENT_ERROR : U_ZERO_ERROR;
    }
    
    if(options[2].doesOccur) {
      u_setDataDirectory(options[2].value);
    }

    if(options[5].doesOccur) {
      cmd_millis();
      didSomething=TRUE;
    } 
    if(options[4].doesOccur) {
      cmd_listplugins();
      didSomething = TRUE;
    }

    if(options[3].doesOccur) {
      cmd_version(FALSE, errorCode);
      didSomething = TRUE;
    }

    if(options[7].doesOccur) {  /* 2nd part of version: cleanup */
      FILE *out = fopen(options[7].value, "w");
      if(out==NULL) {
        fprintf(stderr,"ERR: can't write to XML file %s\n", options[7].value);
        return 1;
      }
      /* todo: API for writing DTD? */
      fprintf(out, "<?xml version=\"1.0\" encoding=\"UTF-8\" ?>\n");
      udbg_writeIcuInfo(out);
      fclose(out);
      didSomething = TRUE;
    }

    if(options[6].doesOccur) {  /* 2nd part of version: cleanup */
      cmd_cleanup();
      didSomething = TRUE;
    }

    if(!didSomething) {
      cmd_version(FALSE, errorCode);  /* at least print the version # */
    }

    return U_FAILURE(errorCode);
}